

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1537.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s;
  size_t sVar4;
  void *__s1;
  char *pcVar5;
  char *pcVar6;
  int outlen;
  uchar a [14];
  int local_44;
  undefined6 local_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  
  uStack_38 = 0xf7e6d5c4b3a2;
  local_40 = 0x3e3d3c3b3a2f;
  local_3a = 0x913f;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    pcVar5 = (char *)0x0;
    uVar3 = curl_easy_escape(0,&local_40,0xe);
    curl_mprintf("%s\n",uVar3);
    curl_free(uVar3);
    __s = (char *)curl_escape(&local_40,0xe);
    curl_mprintf("%s\n",__s);
    if (__s == (char *)0x0) {
      iVar1 = 0x7e;
    }
    else {
      sVar4 = strlen(__s);
      iVar1 = 0;
      __s1 = (void *)curl_easy_unescape(0,__s,sVar4 & 0xffffffff,&local_44);
      curl_mprintf("outlen == %d\n",local_44);
      iVar2 = bcmp(__s1,&local_40,(long)local_44);
      pcVar6 = "no";
      pcVar5 = "no";
      if (iVar2 == 0) {
        pcVar5 = "YES";
      }
      curl_mprintf("unescape == original? %s\n",pcVar5);
      curl_free(__s1);
      sVar4 = strlen(__s);
      pcVar5 = (char *)curl_unescape(__s,sVar4 & 0xffffffff);
      if (pcVar5 == (char *)0x0) {
        iVar1 = 0x7e;
        pcVar5 = __s;
      }
      else {
        sVar4 = strlen(pcVar5);
        local_44 = (int)sVar4;
        curl_mprintf("[old] outlen == %d\n",sVar4 & 0xffffffff);
        iVar2 = bcmp(pcVar5,&local_40,(long)local_44);
        if (iVar2 == 0) {
          pcVar6 = "YES";
        }
        curl_mprintf("[old] unescape == original? %s\n",pcVar6);
        curl_free(pcVar5);
        curl_free(__s);
        uVar3 = curl_easy_escape(0,&local_40,0xffffffff);
        curl_mprintf("escape -1 length: %s\n",uVar3);
        local_44 = 0x7e1;
        pcVar5 = (char *)curl_easy_unescape(0,"moahahaha",0xffffffff,&local_44);
        curl_mprintf("unescape -1 length: %s %d\n",pcVar5,local_44);
      }
    }
    curl_free(pcVar5);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  const unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                             0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;
  int outlen;
  char *raw;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  printf("%s\n", ptr);
  curl_free(ptr);

  /* deprecated API */
  ptr = curl_escape((char *)a, asize);
  printf("%s\n", ptr);
  if(!ptr) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  raw = curl_easy_unescape(NULL, ptr, (int)strlen(ptr), &outlen);
  printf("outlen == %d\n", outlen);
  printf("unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);

  /* deprecated API */
  raw = curl_unescape(ptr, (int)strlen(ptr));
  if(!raw) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  outlen = (int)strlen(raw);
  printf("[old] outlen == %d\n", outlen);
  printf("[old] unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);
  curl_free(ptr);

  /* weird input length */
  ptr = curl_easy_escape(NULL, (char *)a, -1);
  printf("escape -1 length: %s\n", ptr);

  /* weird input length */
  outlen = 2017; /* just a value */
  ptr = curl_easy_unescape(NULL, (char *)"moahahaha", -1, &outlen);
  printf("unescape -1 length: %s %d\n", ptr, outlen);

test_cleanup:
  curl_free(ptr);
  curl_global_cleanup();

  return (int)res;
}